

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# net.cpp
# Opt level: O1

void __thiscall CConnman::ASMapHealthCheck(CConnman *this)

{
  pointer pCVar1;
  long in_FS_OFFSET;
  vector<CNetAddr,_std::allocator<CNetAddr>_> clearnet_addrs;
  vector<CAddress,_std::allocator<CAddress>_> v6_addrs;
  vector<CAddress,_std::allocator<CAddress>_> v4_addrs;
  vector<CNetAddr,_std::allocator<CNetAddr>_> local_98;
  vector<CAddress,_std::allocator<CAddress>_> local_80;
  vector<CAddress,_std::allocator<CAddress>_> local_68;
  direct_or_indirect local_50;
  uint local_40;
  undefined8 local_38;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  GetAddresses(&local_68,this,0,0,(optional<Network>)0x100000001,false);
  GetAddresses(&local_80,this,0,0,(optional<Network>)0x100000002,false);
  local_98.super__Vector_base<CNetAddr,_std::allocator<CNetAddr>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  local_98.super__Vector_base<CNetAddr,_std::allocator<CNetAddr>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  local_98.super__Vector_base<CNetAddr,_std::allocator<CNetAddr>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  std::vector<CNetAddr,_std::allocator<CNetAddr>_>::reserve
            (&local_98,
             ((long)local_80.super__Vector_base<CAddress,_std::allocator<CAddress>_>._M_impl.
                    super__Vector_impl_data._M_finish -
              (long)local_80.super__Vector_base<CAddress,_std::allocator<CAddress>_>._M_impl.
                    super__Vector_impl_data._M_start >> 3) * 0x6db6db6db6db6db7 +
             ((long)local_68.super__Vector_base<CAddress,_std::allocator<CAddress>_>._M_impl.
                    super__Vector_impl_data._M_finish -
              (long)local_68.super__Vector_base<CAddress,_std::allocator<CAddress>_>._M_impl.
                    super__Vector_impl_data._M_start >> 3) * 0x6db6db6db6db6db7);
  if (local_68.super__Vector_base<CAddress,_std::allocator<CAddress>_>._M_impl.
      super__Vector_impl_data._M_start !=
      local_68.super__Vector_base<CAddress,_std::allocator<CAddress>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    pCVar1 = local_68.super__Vector_base<CAddress,_std::allocator<CAddress>_>._M_impl.
             super__Vector_impl_data._M_start;
    do {
      prevector<16U,_unsigned_char,_unsigned_int,_int>::prevector
                ((prevector<16U,_unsigned_char,_unsigned_int,_int> *)&local_50.indirect_contents,
                 (prevector<16U,_unsigned_char,_unsigned_int,_int> *)pCVar1);
      local_38 = *(undefined8 *)((long)&pCVar1->super_CService + 0x18);
      std::vector<CNetAddr,_std::allocator<CNetAddr>_>::emplace_back<CNetAddr>
                (&local_98,(CNetAddr *)&local_50.indirect_contents);
      if (0x10 < local_40) {
        free(local_50.indirect_contents.indirect);
        local_50.indirect_contents.indirect = (char *)0x0;
      }
      pCVar1 = pCVar1 + 1;
    } while (pCVar1 != local_68.super__Vector_base<CAddress,_std::allocator<CAddress>_>._M_impl.
                       super__Vector_impl_data._M_finish);
  }
  if (local_80.super__Vector_base<CAddress,_std::allocator<CAddress>_>._M_impl.
      super__Vector_impl_data._M_start !=
      local_80.super__Vector_base<CAddress,_std::allocator<CAddress>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    pCVar1 = local_80.super__Vector_base<CAddress,_std::allocator<CAddress>_>._M_impl.
             super__Vector_impl_data._M_start;
    do {
      prevector<16U,_unsigned_char,_unsigned_int,_int>::prevector
                ((prevector<16U,_unsigned_char,_unsigned_int,_int> *)&local_50.indirect_contents,
                 (prevector<16U,_unsigned_char,_unsigned_int,_int> *)pCVar1);
      local_38 = *(undefined8 *)((long)&pCVar1->super_CService + 0x18);
      std::vector<CNetAddr,_std::allocator<CNetAddr>_>::emplace_back<CNetAddr>
                (&local_98,(CNetAddr *)&local_50.indirect_contents);
      if (0x10 < local_40) {
        free(local_50.indirect_contents.indirect);
        local_50.indirect_contents.indirect = (char *)0x0;
      }
      pCVar1 = pCVar1 + 1;
    } while (pCVar1 != local_80.super__Vector_base<CAddress,_std::allocator<CAddress>_>._M_impl.
                       super__Vector_impl_data._M_finish);
  }
  NetGroupManager::ASMapHealthCheck(this->m_netgroupman,&local_98);
  std::vector<CNetAddr,_std::allocator<CNetAddr>_>::~vector(&local_98);
  std::vector<CAddress,_std::allocator<CAddress>_>::~vector(&local_80);
  std::vector<CAddress,_std::allocator<CAddress>_>::~vector(&local_68);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void CConnman::ASMapHealthCheck()
{
    const std::vector<CAddress> v4_addrs{GetAddresses(/*max_addresses=*/ 0, /*max_pct=*/ 0, Network::NET_IPV4, /*filtered=*/ false)};
    const std::vector<CAddress> v6_addrs{GetAddresses(/*max_addresses=*/ 0, /*max_pct=*/ 0, Network::NET_IPV6, /*filtered=*/ false)};
    std::vector<CNetAddr> clearnet_addrs;
    clearnet_addrs.reserve(v4_addrs.size() + v6_addrs.size());
    std::transform(v4_addrs.begin(), v4_addrs.end(), std::back_inserter(clearnet_addrs),
        [](const CAddress& addr) { return static_cast<CNetAddr>(addr); });
    std::transform(v6_addrs.begin(), v6_addrs.end(), std::back_inserter(clearnet_addrs),
        [](const CAddress& addr) { return static_cast<CNetAddr>(addr); });
    m_netgroupman.ASMapHealthCheck(clearnet_addrs);
}